

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode JsDiagRequestAsyncBreak(JsRuntimeHandle runtimeHandle)

{
  bool bVar1;
  int iVar2;
  JsrtDebugManager *this;
  JsErrorCode JVar3;
  JsrtRuntime *runtime;
  ScriptContext *scriptContext;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    this = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
    JVar3 = JsErrorDiagNotInDebugMode;
    if (this != (JsrtDebugManager *)0x0) {
      bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this);
      if (bVar1) {
        for (scriptContext = *(ScriptContext **)(*runtimeHandle + 0x10e0); JVar3 = JsNoError,
            scriptContext != (ScriptContext *)0x0; scriptContext = scriptContext->next) {
          iVar2 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])
                            (scriptContext);
          JVar3 = JsNoError;
          if ((char)iVar2 != '\0') break;
          JsrtDebugManager::EnableAsyncBreak(this,scriptContext);
        }
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar3;
}

Assistant:

CHAKRA_API JsDiagRequestAsyncBreak(
    _In_ JsRuntimeHandle runtimeHandle)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            jsrtDebugManager->EnableAsyncBreak(scriptContext);
        }

        return JsNoError;
    });
#endif
}